

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_all_tiles(tgestate_t *state)

{
  tileindex_t *window_00;
  tgestate_t *in_RDI;
  uint8_t iters;
  uint8_t x;
  supertileindex_t *unaff_retaddr;
  uint8_t *window;
  supertileindex_t *maptiles;
  tileindex_t *vistiles;
  char local_22;
  
  window_00 = in_RDI->tile_buf;
  check_map_buf(in_RDI);
  local_22 = (char)in_RDI->columns;
  do {
    plot_vertical_tiles_common
              ((tgestate_t *)maptiles,window,unaff_retaddr,(uint8_t)((ulong)in_RDI >> 0x38),
               window_00);
    window_00 = window_00 + 1;
    local_22 = local_22 + -1;
  } while (local_22 != '\0');
  return;
}

Assistant:

void plot_all_tiles(tgestate_t *state)
{
  tileindex_t      *vistiles; /* was DE */
  supertileindex_t *maptiles; /* was HL' */
  uint8_t          *window;   /* was DE' */
  uint8_t           x;        /* was A */
  uint8_t           iters;    /* was B' */

  assert(state != NULL);
  ASSERT_MAP_POSITION_VALID(state->map_position);

  vistiles = &state->tile_buf[0];   /* visible tiles array */
  maptiles = &state->map_buf[0];    /* 7x5 supertile refs */
  window   = &state->window_buf[0]; /* screen buffer start address */
  x        = state->map_position.x; /* map_position x */

  check_map_buf(state);

  iters = state->columns; /* Conv: was 24 */
  do
  {
    plot_vertical_tiles_common(state, vistiles, maptiles, x, window);
    vistiles++;
    x++;
    if ((x & 3) == 0)
      maptiles++;
    window++;
  }
  while (--iters);
}